

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall Runtime::popVarEnv(Runtime *this)

{
  VarEnv *this_00;
  
  this_00 = (VarEnv *)
            (this->varEnvs).super__Fwd_list_base<VarEnv_*,_std::allocator<VarEnv_*>_>._M_impl.
            _M_head._M_next[1]._M_next;
  if (this_00 != (VarEnv *)0x0) {
    VarEnv::~VarEnv(this_00);
    operator_delete(this_00);
  }
  std::forward_list<VarEnv_*,_std::allocator<VarEnv_*>_>::pop_front(&this->varEnvs);
  return;
}

Assistant:

void Runtime::popVarEnv() {
    if ((*(varEnvs.begin())) != NULL) {
        delete (*(varEnvs.begin()));
    }
    varEnvs.pop_front();
}